

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfQueue.c
# Opt level: O3

void sbfQueue_dispatch(sbfQueue queue)

{
  sbfQueueItemImpl *psVar1;
  sbfQueueItemImpl *psVar2;
  sbfQueueItemImpl *psVar3;
  sbfQueueItemImpl *psVar4;
  long lVar5;
  int *piVar6;
  bool bVar7;
  
  LOCK();
  (queue->mRefCount).mRefCount = (queue->mRefCount).mRefCount + 1;
  UNLOCK();
  sbfLog_log(queue->mLog,0,"queue %p entered",queue);
  psVar1 = &queue->mEmpty;
  do {
    if (((queue->mFlags & 1) == 0) && ((queue->mHiResTimers).rbh_root == (sbfHiResTimerImpl *)0x0))
    {
      psVar4 = queue->mTail;
      psVar2 = psVar4->mNext;
      psVar3 = psVar2;
      if (psVar4 == psVar1) {
        if (psVar2 != (sbfQueueItemImpl *)0x0) {
          queue->mTail = psVar2;
          psVar3 = psVar2->mNext;
          psVar4 = psVar2;
          goto LAB_001024b1;
        }
LAB_001024c0:
        do {
          LOCK();
          queue->mWaiting = 1;
          UNLOCK();
          psVar4 = sbfQueueNext(queue);
          if (psVar4 != (sbfQueueItem)0x0) {
            LOCK();
            queue->mWaiting = 0;
            UNLOCK();
            break;
          }
          do {
            lVar5 = syscall(0xca,&queue->mWaiting,0,1,0,0,0);
            if (lVar5 == 0) break;
            piVar6 = __errno_location();
          } while (*piVar6 != 0xb);
          psVar4 = sbfQueueNext(queue);
        } while (psVar4 == (sbfQueueItem)0x0);
      }
      else {
LAB_001024b1:
        if (psVar3 == (sbfQueueItemImpl *)0x0) {
          if (psVar4 == queue->mHead) {
            (queue->mEmpty).mNext = (sbfQueueItemImpl *)0x0;
            LOCK();
            psVar2 = queue->mHead;
            queue->mHead = psVar1;
            UNLOCK();
            psVar2->mNext = psVar1;
            psVar3 = psVar4->mNext;
            if (psVar3 != (sbfQueueItemImpl *)0x0) goto LAB_00102420;
          }
          goto LAB_001024c0;
        }
LAB_00102420:
        queue->mTail = psVar3;
      }
      if (psVar4->mCb != (sbfQueueCb)0x0) {
        (*psVar4->mCb)(psVar4,psVar4->mClosure);
      }
      lVar5 = *(long *)(psVar4[-1].mData + 0x18);
      LOCK();
      piVar6 = (int *)(*(long *)(lVar5 + 0x28) + 0x1c);
      *piVar6 = *piVar6 + 1;
      UNLOCK();
      do {
        psVar2 = *(sbfQueueItemImpl **)(lVar5 + 0x20);
        psVar4[-1].mNext = psVar2;
        LOCK();
        bVar7 = psVar2 == *(sbfQueueItemImpl **)(lVar5 + 0x20);
        if (bVar7) {
          *(char **)(lVar5 + 0x20) = psVar4[-1].mData + 0x18;
        }
        UNLOCK();
      } while (!bVar7);
      if (psVar4->mCb == (sbfQueueCb)0x0) {
        sbfQueue_removeRef(queue);
        sbfLog_log(queue->mLog,0,"queue %p exited",queue);
        sbfQueue_removeRef(queue);
        return;
      }
    }
    else {
      psVar4 = queue->mTail;
      psVar2 = psVar4->mNext;
      psVar3 = psVar2;
      if (psVar4 == psVar1) {
        if (psVar2 != (sbfQueueItemImpl *)0x0) {
          queue->mTail = psVar2;
          psVar3 = psVar2->mNext;
          psVar4 = psVar2;
          goto LAB_0010241b;
        }
      }
      else {
LAB_0010241b:
        if (psVar3 != (sbfQueueItemImpl *)0x0) goto LAB_00102420;
        if (psVar4 == queue->mHead) {
          (queue->mEmpty).mNext = (sbfQueueItemImpl *)0x0;
          LOCK();
          psVar2 = queue->mHead;
          queue->mHead = psVar1;
          UNLOCK();
          psVar2->mNext = psVar1;
          psVar3 = psVar4->mNext;
          if (psVar3 != (sbfQueueItemImpl *)0x0) goto LAB_00102420;
        }
      }
    }
    sbfHiResTimer_queueDispatch(queue);
  } while( true );
}

Assistant:

void
sbfQueue_dispatch (sbfQueue queue)
{
    sbfQueueItem item;

    sbfQueue_addRef (queue);
    sbfLog_debug (queue->mLog, "queue %p entered", queue);

    for (;;)
    {
        item = sbfQueueDequeue (queue);
        if (SBF_LIKELY (item != NULL))
        {
            if (SBF_LIKELY (item->mCb != NULL))
                item->mCb (item, item->mClosure);
            sbfPool_put (item);
            if (SBF_UNLIKELY (item->mCb == NULL))
            {
                sbfQueue_removeRef (queue);
                break; /* NULL callback means destroyed */
            }
        }
        sbfHiResTimer_queueDispatch (queue);
    }

    sbfLog_debug (queue->mLog, "queue %p exited", queue);
    sbfQueue_removeRef (queue);
}